

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ribbon_artist.cpp
# Opt level: O3

void __thiscall polyscope::RibbonArtist::createProgram(RibbonArtist *this)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  byte bVar10;
  byte bVar11;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar12;
  Engine *pEVar13;
  pointer paVar14;
  pointer pvVar15;
  vec<3,_float,_(glm::qualifier)0> *pvVar16;
  ulong uVar17;
  uint uVar18;
  vec<3,_float,_(glm::qualifier)0> *pvVar19;
  long lVar20;
  long in_R9;
  long in_R10;
  long in_R11;
  ulong uVar21;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *pn;
  ushort uVar22;
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  double dVar35;
  undefined1 auVar36 [56];
  undefined1 auVar41 [12];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vec3 vVar44;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  colors;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  normals;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  uint restartInd;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  positions;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
  line;
  vec<3,_float,_(glm::qualifier)0> local_1b8;
  undefined1 local_1a8 [16];
  vec<3,_float,_(glm::qualifier)0> *local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  void *local_168;
  iterator iStack_160;
  uint *local_158;
  uint local_14c;
  vec<3,_float,_(glm::qualifier)0> **local_148;
  iterator iStack_140;
  vec<3,_float,_(glm::qualifier)0> *local_138 [2];
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_128;
  undefined4 uStack_124;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_120;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
  local_118;
  uint local_fc;
  vec<3,_float,_(glm::qualifier)0> local_f8;
  RibbonArtist *local_e8;
  ValueColorMap *local_e0;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 local_78 [64];
  ulong uVar23;
  
  pEVar13 = render::engine;
  auVar41 = in_ZMM2._4_12_;
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"RIBBON","");
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar20 = 0;
  (*pEVar13->_vptr_Engine[0x23])(local_1a8,pEVar13,&local_148);
  this_00 = (this->program).
            super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_1a8._0_8_;
  (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_;
  local_1a8 = ZEXT816(0) << 0x40;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  local_14c = 0xffffffff;
  peVar6 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar6->_vptr_ShaderProgram[0x1d])(peVar6,0xffffffff);
  local_138[0] = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198 = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  local_158 = (uint *)0x0;
  local_78._0_8_ = state::lengthScale * this->normalOffsetFraction;
  local_148 = (vec<3,_float,_(glm::qualifier)0> **)0x0;
  iStack_140._M_current = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8 = ZEXT816(0);
  local_168 = (void *)0x0;
  iStack_160._M_current = (uint *)0x0;
  local_e0 = render::Engine::getColorMap(render::engine,&this->cMap);
  pvVar15 = (this->ribbons).
            super__Vector_base<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>,_std::allocator<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->ribbons).
      super__Vector_base<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>,_std::allocator<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar15) {
    auVar24._0_4_ = (float)(double)local_78._0_8_;
    auVar24._4_12_ = auVar41;
    uVar18 = 0;
    uVar21 = 0;
    local_78 = vbroadcastss_avx512f(auVar24);
    local_e8 = this;
    do {
      std::
      vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
      ::vector(&local_118,pvVar15 + uVar21);
      pvVar16 = (local_118.
                 super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
      if (local_118.
          super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_118.
          super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        uVar17 = 0;
        auVar27 = vpbroadcastq_avx512f();
        auVar27 = vpsrlq_avx512f(auVar27,4);
        pvVar19 = (local_118.
                   super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
        do {
          auVar28 = vpbroadcastq_avx512f();
          uVar17 = uVar17 + 0x10;
          auVar29 = vporq_avx512f(auVar28,auVar25);
          auVar28 = vporq_avx512f(auVar28,auVar26);
          uVar7 = vpcmpuq_avx512f(auVar28,auVar27,2);
          bVar10 = (byte)uVar7;
          uVar7 = vpcmpuq_avx512f(auVar29,auVar27,2);
          bVar11 = (byte)uVar7;
          uVar22 = CONCAT11(bVar11,bVar10);
          uVar23 = (ulong)uVar22;
          auVar29 = vgatherdps_avx512f(*(undefined4 *)((long)&pvVar19[1].field_0 + lVar20));
          auVar28._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar29._4_4_;
          auVar28._0_4_ = (uint)(bVar10 & 1) * auVar29._0_4_;
          auVar28._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar29._8_4_;
          auVar28._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar29._12_4_;
          auVar28._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * auVar29._16_4_;
          auVar28._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * auVar29._20_4_;
          auVar28._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * auVar29._24_4_;
          auVar28._28_4_ = (uint)((byte)(uVar22 >> 7) & 1) * auVar29._28_4_;
          auVar28._32_4_ = (uint)(bVar11 & 1) * auVar29._32_4_;
          auVar28._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar29._36_4_;
          auVar28._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar29._40_4_;
          auVar28._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar29._44_4_;
          auVar28._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar29._48_4_;
          auVar28._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar29._52_4_;
          auVar28._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar29._56_4_;
          auVar28._60_4_ = (uint)(bVar11 >> 7) * auVar29._60_4_;
          auVar30 = vgatherdps_avx512f(*(undefined4 *)((long)&pvVar19->field_0 + in_R9));
          auVar29._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar30._4_4_;
          auVar29._0_4_ = (uint)(bVar10 & 1) * auVar30._0_4_;
          auVar29._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar30._8_4_;
          auVar29._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar30._12_4_;
          auVar29._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * auVar30._16_4_;
          auVar29._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * auVar30._20_4_;
          auVar29._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * auVar30._24_4_;
          auVar29._28_4_ = (uint)((byte)(uVar22 >> 7) & 1) * auVar30._28_4_;
          auVar29._32_4_ = (uint)(bVar11 & 1) * auVar30._32_4_;
          auVar29._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar30._36_4_;
          auVar29._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar30._40_4_;
          auVar29._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar30._44_4_;
          auVar29._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar30._48_4_;
          auVar29._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar30._52_4_;
          auVar29._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar30._56_4_;
          auVar29._60_4_ = (uint)(bVar11 >> 7) * auVar30._60_4_;
          auVar30 = vgatherdps_avx512f(*(undefined4 *)((long)&pvVar19->field_0 + in_R10));
          auVar31._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar30._4_4_;
          auVar31._0_4_ = (uint)(bVar10 & 1) * auVar30._0_4_;
          auVar31._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar30._8_4_;
          auVar31._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar30._12_4_;
          auVar31._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * auVar30._16_4_;
          auVar31._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * auVar30._20_4_;
          auVar31._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * auVar30._24_4_;
          auVar31._28_4_ = (uint)((byte)(uVar22 >> 7) & 1) * auVar30._28_4_;
          auVar31._32_4_ = (uint)(bVar11 & 1) * auVar30._32_4_;
          auVar31._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar30._36_4_;
          auVar31._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar30._40_4_;
          auVar31._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar30._44_4_;
          auVar31._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar30._48_4_;
          auVar31._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar30._52_4_;
          auVar31._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar30._56_4_;
          auVar31._60_4_ = (uint)(bVar11 >> 7) * auVar30._60_4_;
          auVar30 = vgatherdps_avx512f(*(undefined4 *)((long)&pvVar19->field_0 + lVar20));
          auVar32._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar30._4_4_;
          auVar32._0_4_ = (uint)(bVar10 & 1) * auVar30._0_4_;
          auVar32._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar30._8_4_;
          auVar32._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar30._12_4_;
          auVar32._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * auVar30._16_4_;
          auVar32._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * auVar30._20_4_;
          auVar32._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * auVar30._24_4_;
          auVar32._28_4_ = (uint)((byte)(uVar22 >> 7) & 1) * auVar30._28_4_;
          auVar32._32_4_ = (uint)(bVar11 & 1) * auVar30._32_4_;
          auVar32._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar30._36_4_;
          auVar32._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar30._40_4_;
          auVar32._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar30._44_4_;
          auVar32._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar30._48_4_;
          auVar32._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar30._52_4_;
          auVar32._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar30._56_4_;
          auVar32._60_4_ = (uint)(bVar11 >> 7) * auVar30._60_4_;
          auVar28 = vmulps_avx512f(auVar28,local_78);
          auVar29 = vmulps_avx512f(auVar29,local_78);
          auVar30 = vmulps_avx512f(auVar31,local_78);
          auVar28 = vaddps_avx512f(auVar28,auVar32);
          vscatterdps_avx512f(ZEXT864(pvVar19) + _DAT_002ab800,uVar23,auVar28);
          auVar28 = vgatherdps_avx512f(*(undefined4 *)((long)&pvVar19->field_0 + in_R11));
          auVar33._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar28._4_4_;
          auVar33._0_4_ = (uint)(bVar10 & 1) * auVar28._0_4_;
          auVar33._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar28._8_4_;
          auVar33._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar28._12_4_;
          auVar33._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * auVar28._16_4_;
          auVar33._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * auVar28._20_4_;
          auVar33._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * auVar28._24_4_;
          auVar33._28_4_ = (uint)((byte)(uVar22 >> 7) & 1) * auVar28._28_4_;
          auVar33._32_4_ = (uint)(bVar11 & 1) * auVar28._32_4_;
          auVar33._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar28._36_4_;
          auVar33._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar28._40_4_;
          auVar33._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar28._44_4_;
          auVar33._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar28._48_4_;
          auVar33._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar28._52_4_;
          auVar33._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar28._56_4_;
          auVar33._60_4_ = (uint)(bVar11 >> 7) * auVar28._60_4_;
          auVar28 = vaddps_avx512f(auVar29,auVar33);
          vscatterdps_avx512f(ZEXT864(pvVar19) + _DAT_002ab8c0,uVar23,auVar28);
          auVar28 = vgatherdps_avx512f(*(undefined4 *)((long)&pvVar19->field_0 + uVar21));
          auVar34._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar28._4_4_;
          auVar34._0_4_ = (uint)(bVar10 & 1) * auVar28._0_4_;
          auVar34._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar28._8_4_;
          auVar34._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar28._12_4_;
          auVar34._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * auVar28._16_4_;
          auVar34._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * auVar28._20_4_;
          auVar34._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * auVar28._24_4_;
          auVar34._28_4_ = (uint)((byte)(uVar22 >> 7) & 1) * auVar28._28_4_;
          auVar34._32_4_ = (uint)(bVar11 & 1) * auVar28._32_4_;
          auVar34._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar28._36_4_;
          auVar34._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar28._40_4_;
          auVar34._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar28._44_4_;
          auVar34._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar28._48_4_;
          auVar34._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar28._52_4_;
          auVar34._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar28._56_4_;
          auVar34._60_4_ = (uint)(bVar11 >> 7) * auVar28._60_4_;
          auVar28 = vaddps_avx512f(auVar30,auVar34);
          vscatterdps_avx512f(ZEXT864(pvVar19) + _DAT_002ab900,uVar23,auVar28);
          pvVar19 = pvVar19 + 0x20;
          pvVar16 = (local_118.
                     super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_elems;
        } while (((ulong)((long)local_118.
                                super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish +
                         (-0x18 - (long)local_118.
                                        super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)) / 0x18 + 0x10 &
                 0xfffffffffffffff0) != uVar17);
      }
      if (1 < (ulong)(((long)pvVar16 -
                       (long)local_118.
                             super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))
      {
        dVar35 = std::
                 generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)&util_mersenne_twister);
        auVar36 = (undefined1  [56])0x0;
        vVar44 = render::ValueColorMap::getValue(local_e0,dVar35 + 0.0);
        local_1b8.field_2 = vVar44.field_2;
        auVar25._0_8_ = vVar44._0_8_;
        auVar25._8_56_ = auVar36;
        local_1b8._0_8_ = vmovlpd_avx(auVar25._0_16_);
        uVar17 = *(ulong *)local_118.
                           super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = uVar17;
        uVar2 = local_118.
                super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1]._M_elems[0].field_0;
        uVar4 = local_118.
                super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1]._M_elems[0].field_1;
        auVar42._4_4_ = uVar4;
        auVar42._0_4_ = uVar2;
        auVar42._8_8_ = 0;
        auVar24 = vsubps_avx(auVar37,auVar42);
        auVar8._8_4_ = 0x3c23d70a;
        auVar8._0_8_ = 0x3c23d70a3c23d70a;
        auVar8._12_4_ = 0x3c23d70a;
        auVar24 = vmulps_avx512vl(auVar24,auVar8);
        local_f8.field_2.z =
             ((anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
             ((long)local_118.
                    super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 8))->z +
             (((anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
              ((long)local_118.
                     super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 8))->z -
             (((vec<3,_float,_(glm::qualifier)0> *)
              ((long)local_118.
                     super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x18))->field_2).z) * 0.01;
        auVar38._0_4_ = (float)uVar17 + auVar24._0_4_;
        auVar38._4_4_ = (float)(uVar17 >> 0x20) + auVar24._4_4_;
        auVar38._8_4_ = auVar24._8_4_ + 0.0;
        auVar38._12_4_ = auVar24._12_4_ + 0.0;
        local_f8._0_8_ = vmovlps_avx(auVar38);
        if (iStack_140._M_current == local_138[0]) {
          std::
          vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                    ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                      *)&local_148,iStack_140,&local_f8);
        }
        else {
          ((iStack_140._M_current)->field_2).z = (float)local_f8.field_2;
          (iStack_140._M_current)->field_0 = local_f8.field_0;
          (iStack_140._M_current)->field_1 = local_f8.field_1;
          iStack_140._M_current = iStack_140._M_current + 1;
        }
        if (local_188.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_188.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                    ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                      *)&local_188,
                     (iterator)
                     local_188.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (vec<3,_float,_(glm::qualifier)0> *)
                     ((long)local_118.
                            super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 0xc));
        }
        else {
          *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
           &(local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length =
               ((vec<3,_float,_(glm::qualifier)0> *)
               ((long)local_118.
                      super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 0xc))->field_2;
          (local_188.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus =
               *(undefined8 *)
                ((long)local_118.
                       super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0xc);
          local_188.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)local_188.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 0xc);
        }
        if ((vec<3,_float,_(glm::qualifier)0> *)local_1a8._8_8_ == local_198) {
          std::
          vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                    ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                      *)local_1a8,(iterator)local_1a8._8_8_,&local_1b8);
        }
        else {
          *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(local_1a8._8_8_ + 8) =
               local_1b8.field_2;
          *(undefined8 *)local_1a8._8_8_ = local_1b8._0_8_;
          local_1a8._8_8_ = (vec<3,_float,_(glm::qualifier)0> *)(local_1a8._8_8_ + 0xc);
        }
        _local_128 = CONCAT44(uStack_124,uVar18);
        if (iStack_160._M_current == local_158) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_168,iStack_160,
                     (uint *)&local_128);
          pvVar16 = (local_118.
                     super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
          pvVar19 = (local_118.
                     super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_elems;
        }
        else {
          *iStack_160._M_current = uVar18;
          iStack_160._M_current = iStack_160._M_current + 1;
          pvVar16 = (local_118.
                     super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
          pvVar19 = (local_118.
                     super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_elems;
        }
        while (paVar14 = local_118.
                         super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
              pvVar16 !=
              (local_118.
               super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_elems) {
          if (iStack_140._M_current == local_138[0]) {
            local_118.
            super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)pvVar19;
            std::
            vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                      ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                        *)&local_148,iStack_140,pvVar16);
          }
          else {
            (iStack_140._M_current)->field_2 = pvVar16->field_2;
            aVar12 = pvVar16->field_1;
            (iStack_140._M_current)->field_0 = pvVar16->field_0;
            (iStack_140._M_current)->field_1 = aVar12;
            iStack_140._M_current = iStack_140._M_current + 1;
            local_118.
            super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)pvVar19;
          }
          if (local_188.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_188.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                      ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                        *)&local_188,
                       (iterator)
                       local_188.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,pvVar16 + 1);
          }
          else {
            *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
             &(local_188.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length = pvVar16[1].field_2;
            (local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus = *(undefined8 *)(pvVar16 + 1)
            ;
            local_188.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((long)local_188.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 0xc);
          }
          if ((vec<3,_float,_(glm::qualifier)0> *)local_1a8._8_8_ == local_198) {
            std::
            vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                      ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                        *)local_1a8,(iterator)local_1a8._8_8_,&local_1b8);
          }
          else {
            *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(local_1a8._8_8_ + 8)
                 = local_1b8.field_2;
            *(undefined8 *)local_1a8._8_8_ = local_1b8._0_8_;
            local_1a8._8_8_ = (vec<3,_float,_(glm::qualifier)0> *)(local_1a8._8_8_ + 0xc);
          }
          uVar18 = uVar18 + 1;
          _local_128 = CONCAT44(uStack_124,uVar18);
          if (iStack_160._M_current == local_158) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_168,iStack_160,
                       (uint *)&local_128);
          }
          else {
            *iStack_160._M_current = uVar18;
            iStack_160._M_current = iStack_160._M_current + 1;
          }
          pvVar16 = pvVar16 + 2;
          pvVar19 = (local_118.
                     super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_elems;
          local_118.
          super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = paVar14;
        }
        uVar3 = pvVar19[-4].field_0;
        uVar5 = pvVar19[-4].field_1;
        auVar39._4_4_ = uVar5;
        auVar39._0_4_ = uVar3;
        auVar39._8_8_ = 0;
        uVar17._0_4_ = pvVar19[-2].field_0;
        uVar17._4_4_ = pvVar19[-2].field_1;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = uVar17;
        uVar1 = uVar18 + 1;
        auVar24 = vsubps_avx(auVar43,auVar39);
        auVar9._8_4_ = 0x3c23d70a;
        auVar9._0_8_ = 0x3c23d70a3c23d70a;
        auVar9._12_4_ = 0x3c23d70a;
        auVar24 = vmulps_avx512vl(auVar24,auVar9);
        local_120.z = pvVar19[-2].field_2.z + (pvVar19[-2].field_2.z - pvVar19[-4].field_2.z) * 0.01
        ;
        auVar40._0_4_ = (float)(undefined4)uVar17 + auVar24._0_4_;
        auVar40._4_4_ = (float)uVar17._4_4_ + auVar24._4_4_;
        auVar40._8_4_ = auVar24._8_4_ + 0.0;
        auVar40._12_4_ = auVar24._12_4_ + 0.0;
        _local_128 = vmovlps_avx(auVar40);
        if (iStack_140._M_current == local_138[0]) {
          local_118.
          super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pvVar19;
          std::
          vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                    ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                      *)&local_148,iStack_140,(vec<3,_float,_(glm::qualifier)0> *)&local_128);
        }
        else {
          ((iStack_140._M_current)->field_2).z = (float)local_120;
          (iStack_140._M_current)->field_0 =
               (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)_local_128;
          (iStack_140._M_current)->field_1 =
               (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
               (int)((ulong)_local_128 >> 0x20);
          iStack_140._M_current = iStack_140._M_current + 1;
          local_118.
          super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pvVar19;
        }
        this = local_e8;
        if (local_188.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_188.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                    ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                      *)&local_188,
                     (iterator)
                     local_188.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (vec<3,_float,_(glm::qualifier)0> *)
                     ((long)local_118.
                            super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -0xc));
        }
        else {
          *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
           &(local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length =
               ((vec<3,_float,_(glm::qualifier)0> *)
               ((long)local_118.
                      super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -0xc))->field_2;
          (local_188.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus =
               *(undefined8 *)
                ((long)local_118.
                       super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -0xc);
          local_188.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)local_188.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 0xc);
        }
        if ((vec<3,_float,_(glm::qualifier)0> *)local_1a8._8_8_ == local_198) {
          std::
          vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                    ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                      *)local_1a8,(iterator)local_1a8._8_8_,&local_1b8);
        }
        else {
          *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(local_1a8._8_8_ + 8) =
               local_1b8.field_2;
          *(undefined8 *)local_1a8._8_8_ = local_1b8._0_8_;
          local_1a8._8_8_ = (vec<3,_float,_(glm::qualifier)0> *)(local_1a8._8_8_ + 0xc);
        }
        local_fc = uVar1;
        if (iStack_160._M_current == local_158) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_168,iStack_160,
                     &local_fc);
        }
        else {
          *iStack_160._M_current = uVar1;
          iStack_160._M_current = iStack_160._M_current + 1;
        }
        if (iStack_160._M_current == local_158) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_168,iStack_160,
                     &local_14c);
        }
        else {
          *iStack_160._M_current = local_14c;
          iStack_160._M_current = iStack_160._M_current + 1;
        }
        uVar18 = uVar18 + 2;
      }
      if ((local_118.
           super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_elems !=
          (vec<3,_float,_(glm::qualifier)0> *)0x0) {
        operator_delete(local_118.
                        super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      pvVar15 = (this->ribbons).
                super__Vector_base<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>,_std::allocator<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar21 = uVar21 + 1;
    } while (uVar21 < (ulong)(((long)(this->ribbons).
                                     super__Vector_base<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>,_std::allocator<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar15 >> 3
                              ) * -0x5555555555555555));
  }
  peVar6 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"a_position","");
  (*peVar6->_vptr_ShaderProgram[0x10])(peVar6,local_98,&local_148,0,0,0xffffffff);
  if (local_98[0] != local_88) {
    operator_delete(local_98[0]);
  }
  peVar6 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"a_normal","");
  (*peVar6->_vptr_ShaderProgram[0x10])(peVar6,local_b8,&local_188,0,0,0xffffffff);
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0]);
  }
  peVar6 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"a_color","");
  (*peVar6->_vptr_ShaderProgram[0x10])(peVar6,local_d8,local_1a8,0,0,0xffffffff);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0]);
  }
  peVar6 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar6->_vptr_ShaderProgram[0x1c])(peVar6,&local_168);
  render::Engine::setMaterial
            (render::engine,
             (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,&(this->material).value);
  if (local_168 != (void *)0x0) {
    operator_delete(local_168);
  }
  if ((void *)local_1a8._0_8_ != (void *)0x0) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if (local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_148 != (vec<3,_float,_(glm::qualifier)0> **)0x0) {
    operator_delete(local_148);
  }
  return;
}

Assistant:

void RibbonArtist::createProgram() {

  // Create the program
  program = render::engine->requestShader("RIBBON", {});

  // Set the restart index for the line strip
  unsigned int restartInd = -1;
  program->setPrimitiveRestartIndex(restartInd);

  // Compute length scales and whatnot
  float normalOffset = static_cast<float>(state::lengthScale * normalOffsetFraction);

  // == Fill buffers

  // Trace a whole bunch of lines along the surface
  std::vector<glm::vec3> positions;
  std::vector<glm::vec3> normals;
  std::vector<glm::vec3> colors;
  std::vector<unsigned int> indices;
  unsigned int nPts = 0;
  const render::ValueColorMap& cmapValue = render::engine->getColorMap(cMap);
  for (size_t iLine = 0; iLine < ribbons.size(); iLine++) {

    // Process each point from the list
    std::vector<std::array<glm::vec3, 2>> line = ribbons[iLine];

    // Offset points along normals
    for (std::array<glm::vec3, 2>& x : line) {
      x[0] += x[1] * normalOffset;
    }

    // Fill the render buffer for this line
    if (line.size() <= 1) {
      continue;
    }

    // Sample a color for this line
    glm::vec3 lineColor = cmapValue.getValue(randomUnit());

    // Add a false point at the beginning (so it's not a special case for the geometry shader)
    float EPS = 0.01;
    glm::vec3 fakeFirst = line[0][0] + EPS * (line[0][0] - line[1][0]);
    positions.push_back(fakeFirst);
    normals.push_back(line.front()[1]);
    colors.push_back(lineColor);
    indices.push_back(nPts++);

    // Add all of the real points
    for (auto& pn : line) {
      positions.push_back(pn[0]);
      normals.push_back(pn[1]);
      colors.push_back(lineColor);
      indices.push_back(nPts++);
    }

    // Add a false point at the end too
    glm::vec3 fakeLast = line.back()[0] + EPS * (line.back()[0] - line[line.size() - 2][0]);
    positions.push_back(fakeLast);
    normals.push_back(line.back()[1]);
    colors.push_back(lineColor);
    indices.push_back(nPts++);

    // Restart index allows us to draw multiple lines from a single buffer
    indices.push_back(restartInd);
  }

  // Store the values in GL buffers
  program->setAttribute("a_position", positions);
  program->setAttribute("a_normal", normals);
  program->setAttribute("a_color", colors);
  program->setIndex(indices);

  render::engine->setMaterial(*program, material.get());
}